

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O3

void __thiscall icu_63::ResourceBundle::ResourceBundle(ResourceBundle *this,UErrorCode *err)

{
  Locale *pLVar1;
  UResourceBundle *pUVar2;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__ResourceBundle_003c0600;
  this->fLocale = (Locale *)0x0;
  pLVar1 = Locale::getDefault();
  pUVar2 = ures_open_63((char *)0x0,pLVar1->fullName,err);
  this->fResource = pUVar2;
  return;
}

Assistant:

ResourceBundle::ResourceBundle(UErrorCode &err)
                                :UObject(), fLocale(NULL)
{
    fResource = ures_open(0, Locale::getDefault().getName(), &err);
}